

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9Embed(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  int iVar5;
  Emb_Par_t Pars;
  uint local_78;
  uint local_74;
  uint local_70;
  uint local_6c;
  uint local_68;
  uint local_64;
  uint local_60;
  Emb_Par_t local_5c;
  Abc_Frame_t *local_38;
  
  local_5c.nSols = 2;
  local_70 = 0;
  local_38 = pAbc;
  Extra_UtilGetoptReset();
  local_78 = 10;
  uVar2 = 0x1e;
  local_74 = 0;
  local_6c = 0;
  local_68 = 0;
  local_64 = 0;
  local_60 = 0;
  do {
    while( true ) {
      while( true ) {
        while (iVar1 = Extra_UtilGetopt(argc,argv,"DIrcdlsvh"), iVar5 = globalUtilOptind,
              0x6b < iVar1) {
          if (iVar1 < 0x73) {
            if (iVar1 == 0x6c) {
              local_68 = local_68 ^ 1;
            }
            else {
              if (iVar1 != 0x72) goto LAB_00281d4c;
              local_70 = local_70 ^ 1;
            }
          }
          else if (iVar1 == 0x73) {
            local_64 = local_64 ^ 1;
          }
          else {
            if (iVar1 != 0x76) goto LAB_00281d4c;
            local_60 = local_60 ^ 1;
          }
        }
        if (iVar1 < 99) break;
        if (iVar1 == 99) {
          local_74 = local_74 ^ 1;
        }
        else {
          if (iVar1 != 100) goto LAB_00281d4c;
          local_6c = local_6c ^ 1;
        }
      }
      if (iVar1 == 0x44) break;
      if (iVar1 != 0x49) {
        if (iVar1 == -1) {
          local_5c.fVerbose = local_60;
          local_5c.fShowImage = local_64;
          local_5c.fDumpLarge = local_68;
          local_5c.fDump = local_6c;
          local_5c.fCluster = local_74;
          local_5c.fRefine = local_70;
          local_5c.nIters = local_78;
          local_5c.nDims = uVar2;
          if (local_38->pGia != (Gia_Man_t *)0x0) {
            Gia_ManSolveProblem(local_38->pGia,&local_5c);
            return 0;
          }
          pcVar3 = "Abc_CommandAbc9Embed(): There is no AIG.\n";
          iVar5 = -1;
          goto LAB_00281e97;
        }
        goto LAB_00281d4c;
      }
      if (argc <= globalUtilOptind) {
LAB_00281d39:
        Abc_Print(-1,"Command line switch \"-D\" should be followed by an integer.\n");
        goto LAB_00281d4c;
      }
      local_78 = atoi(argv[globalUtilOptind]);
      globalUtilOptind = iVar5 + 1;
      if ((int)local_78 < 0) goto LAB_00281d4c;
    }
    if (argc <= globalUtilOptind) goto LAB_00281d39;
    uVar2 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar5 + 1;
  } while (-1 < (int)uVar2);
LAB_00281d4c:
  Abc_Print(-2,"usage: &embed [-DI <num>] [-rdlscvh]\n");
  Abc_Print(-2,"\t         fast placement based on high-dimensional embedding from\n");
  Abc_Print(-2,"\t         D. Harel and Y. Koren, \"Graph drawing by high-dimensional\n");
  Abc_Print(-2,"\t         embedding\", J. Graph Algs & Apps, 2004, Vol 8(2), pp. 195-217\n");
  Abc_Print(-2,"\t-D num : the number of dimensions for embedding [default = %d]\n",(ulong)uVar2);
  Abc_Print(-2,"\t-I num : the number of refinement iterations [default = %d]\n",(ulong)local_78);
  pcVar4 = "yes";
  pcVar3 = "yes";
  if (local_70 == 0) {
    pcVar3 = "no";
  }
  Abc_Print(-2,"\t-r     : toggle the use of refinement [default = %s]\n",pcVar3);
  pcVar3 = "yes";
  if (local_74 == 0) {
    pcVar3 = "no";
  }
  Abc_Print(-2,"\t-c     : toggle clustered representation [default = %s]\n",pcVar3);
  pcVar3 = "yes";
  if (local_6c == 0) {
    pcVar3 = "no";
  }
  Abc_Print(-2,"\t-d     : toggle dumping placement into a Gnuplot file [default = %s]\n",pcVar3);
  pcVar3 = "yes";
  if (local_68 == 0) {
    pcVar3 = "no";
  }
  Abc_Print(-2,"\t-l     : toggle dumping Gnuplot for large placement [default = %s]\n",pcVar3);
  pcVar3 = "yes";
  if (local_64 == 0) {
    pcVar3 = "no";
  }
  Abc_Print(-2,"\t-s     : toggle showing image if Gnuplot is installed [default = %s]\n",pcVar3);
  if (local_60 == 0) {
    pcVar4 = "no";
  }
  Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar4);
  pcVar3 = "\t-h     : print the command usage\n";
  iVar5 = -2;
LAB_00281e97:
  Abc_Print(iVar5,pcVar3);
  return 1;
}

Assistant:

int Abc_CommandAbc9Embed( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Emb_Par_t Pars, * pPars = &Pars;
    int c;
    pPars->nDims      = 30;
    pPars->nIters     = 10;
    pPars->nSols      =  2;
    pPars->fRefine    =  0;
    pPars->fCluster   =  0;
    pPars->fDump      =  0;
    pPars->fDumpLarge =  0;
    pPars->fShowImage =  0;
    pPars->fVerbose   =  0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "DIrcdlsvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nDims = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nDims < 0 )
                goto usage;
            break;
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nIters = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nIters < 0 )
                goto usage;
            break;
        case 'r':
            pPars->fRefine ^= 1;
            break;
        case 'c':
            pPars->fCluster ^= 1;
            break;
        case 'd':
            pPars->fDump ^= 1;
            break;
        case 'l':
            pPars->fDumpLarge ^= 1;
            break;
        case 's':
            pPars->fShowImage ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Embed(): There is no AIG.\n" );
        return 1;
    }
    Gia_ManSolveProblem( pAbc->pGia, pPars );
    return 0;

usage:
    Abc_Print( -2, "usage: &embed [-DI <num>] [-rdlscvh]\n" );
    Abc_Print( -2, "\t         fast placement based on high-dimensional embedding from\n" );
    Abc_Print( -2, "\t         D. Harel and Y. Koren, \"Graph drawing by high-dimensional\n" );
    Abc_Print( -2, "\t         embedding\", J. Graph Algs & Apps, 2004, Vol 8(2), pp. 195-217\n" );
    Abc_Print( -2, "\t-D num : the number of dimensions for embedding [default = %d]\n", pPars->nDims );
    Abc_Print( -2, "\t-I num : the number of refinement iterations [default = %d]\n", pPars->nIters );
    Abc_Print( -2, "\t-r     : toggle the use of refinement [default = %s]\n", pPars->fRefine? "yes":"no");
    Abc_Print( -2, "\t-c     : toggle clustered representation [default = %s]\n", pPars->fCluster? "yes":"no");
    Abc_Print( -2, "\t-d     : toggle dumping placement into a Gnuplot file [default = %s]\n", pPars->fDump? "yes":"no");
    Abc_Print( -2, "\t-l     : toggle dumping Gnuplot for large placement [default = %s]\n", pPars->fDumpLarge? "yes":"no");
    Abc_Print( -2, "\t-s     : toggle showing image if Gnuplot is installed [default = %s]\n", pPars->fShowImage? "yes":"no");
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", pPars->fVerbose? "yes":"no");
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}